

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

unsigned_long
pstore::sparse_array<unsigned_int,unsigned_long>::bitmap<unsigned_long_const*,void>
          (unsigned_long *first,unsigned_long *last)

{
  ulong uVar1;
  unsigned_long uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (first == last) {
      return uVar2;
    }
    uVar1 = *first;
    if (0x3f < uVar1) break;
    if ((uVar2 >> (uVar1 & 0x3f) & 1) != 0) {
      assert_failed("(mm & mask) == 0U && \"The same index must not appear more than once in the \" \"collection of sparse indices\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                    ,0x25d);
    }
    uVar2 = uVar2 | 1L << ((byte)uVar1 & 0x3f);
    first = first + 1;
  }
  assert_failed("idx < max_size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x259);
}

Assistant:

BitmapType sparse_array<ValueType, BitmapType>::bitmap (InputIterator first,
                                                            InputIterator last) {
        return std::accumulate (
            first, last, BitmapType{0U},
            [] (BitmapType const mm, typename std::iterator_traits<InputIterator>::value_type const idx) {
                PSTORE_ASSERT (idx < max_size ());
                auto const mask = BitmapType{1U} << idx;
                PSTORE_ASSERT ((mm & mask) == 0U &&
                               "The same index must not appear more than once in the "
                               "collection of sparse indices");
                return static_cast<BitmapType> (mm | mask);
            });
    }